

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

int asm_isk32(ASMState *as,IRRef ref,int32_t *k)

{
  IRIns *pIVar1;
  int iVar2;
  IRIns IVar3;
  ulong uVar4;
  
  iVar2 = 0;
  if (ref < 0x8000) {
    pIVar1 = as->ir;
    uVar4 = (ulong)ref;
    if ((*(char *)((long)pIVar1 + uVar4 * 8 + 5) == '\x1b') ||
       ((0x605fd9U >> (*(uint *)((long)pIVar1 + uVar4 * 8 + 4) & 0x1f) & 1) == 0)) {
      IVar3.gcr.gcptr64._4_4_ = 0;
      IVar3.field_1.op12 = pIVar1[uVar4].field_1.op12;
    }
    else {
      IVar3 = pIVar1[uVar4 + 1];
      if ((IRIns)(long)IVar3.i != IVar3) {
        return 0;
      }
    }
    *k = IVar3.i;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int asm_isk32(ASMState *as, IRRef ref, int32_t *k)
{
  if (irref_isk(ref)) {
    IRIns *ir = IR(ref);
#if LJ_GC64
    if (ir->o == IR_KNULL || !irt_is64(ir->t)) {
      *k = ir->i;
      return 1;
    } else if (checki32((int64_t)ir_k64(ir)->u64)) {
      *k = (int32_t)ir_k64(ir)->u64;
      return 1;
    }
#else
    if (ir->o != IR_KINT64) {
      *k = ir->i;
      return 1;
    } else if (checki32((int64_t)ir_kint64(ir)->u64)) {
      *k = (int32_t)ir_kint64(ir)->u64;
      return 1;
    }
#endif
  }
  return 0;
}